

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O3

void __thiscall
PlayingState::CmdSetCourse
          (PlayingState *this,string *input,shared_ptr<Connection> *connection,
          shared_ptr<GameData> *game_data)

{
  size_type *psVar1;
  Ship *pSVar2;
  uint uVar3;
  int iVar4;
  _func_int **pp_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar6;
  element_type *name;
  bool bVar7;
  undefined7 extraout_var;
  element_type *peVar8;
  ostream *poVar9;
  undefined8 uVar10;
  undefined1 InSpace;
  int iVar11;
  _Base_ptr *__endptr;
  _Base_ptr p_Var12;
  uint uVar13;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  double dVar15;
  shared_ptr<GameData> game_data_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  shared_ptr<Ship> ship;
  shared_ptr<Planet> planet;
  shared_ptr<Player> player;
  string data;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_420;
  double local_408;
  double local_400;
  int local_3f4;
  undefined1 local_3f0 [40];
  shared_ptr<Connection> local_3c8;
  shared_ptr<Connection> local_3b8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_3a8;
  element_type *local_3a0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_398;
  _Base_ptr local_390;
  undefined1 local_388 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  undefined1 local_358 [16];
  vector<int,_std::allocator<int>_> local_348;
  string local_330;
  undefined1 local_310 [32];
  string local_2f0;
  string local_2d0;
  undefined1 local_2b0 [32];
  undefined1 local_290 [32];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 local_250 [32];
  string local_230;
  string local_210;
  _Base_ptr local_1f0;
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Connection>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Connection>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
  local_1e8;
  _Base_ptr local_1b8;
  double local_1b0;
  double local_1a8 [14];
  ios_base local_138 [264];
  
  InSpace = SUB81(game_data,0);
  local_368._M_allocated_capacity = (size_type)local_358;
  pp_Var5 = (this->super_GameState)._vptr_GameState;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,pp_Var5,
             &(((this->super_GameState).game_data.
                super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_connections).
              _M_t._M_impl.field_0x0 + (long)pp_Var5);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_368._M_allocated_capacity,
             (undefined1 *)(local_368._8_8_ + local_368._M_allocated_capacity));
  Tokenizer::GetAllTokens(&local_420,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  Connection::GetPlayer((Connection *)(input->_M_dataplus)._M_p);
  Entity::GetShip((Entity *)local_3f0);
  local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(input->_M_dataplus)._M_p;
  local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)input->_M_string_length;
  if ((element_type *)
      local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    InSpace = 0x48;
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(((element_type *)
                 local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->super_Area).m_area_name._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(((element_type *)
                 local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->super_Area).m_area_name._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  this_00 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  game_data_00.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  game_data_00.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_398._M_pi;
  bVar7 = CheckCockpitCommand(&local_3b8,game_data_00,(bool)InSpace);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((element_type *)
      local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3b8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (!bVar7) goto LAB_00149843;
  if (local_420.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_420.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_001490db:
    if (0x40 < (ulong)((long)local_420.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_420.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      pSVar2 = (Ship *)(local_388 + 0x10);
      pcVar6 = ((local_420.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_388._0_8_ = pSVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,pcVar6,
                 pcVar6 + (local_420.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      bVar7 = Utils::IsNumber((string *)local_388);
      local_3a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pSVar2;
      if (bVar7) {
        pcVar6 = local_420.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d0,pcVar6,
                   pcVar6 + local_420.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        bVar7 = Utils::IsNumber(&local_2d0);
        if (bVar7) {
          pcVar6 = local_420.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f0,pcVar6,
                     pcVar6 + local_420.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
          bVar7 = Utils::IsNumber(&local_2f0);
          __endptr = (_Base_ptr *)(CONCAT71(extraout_var,bVar7) & 0xffffffff);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p);
          }
        }
        else {
          __endptr = (_Base_ptr *)0x0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
        if ((Ship *)local_388._0_8_ != pSVar2) {
          operator_delete((void *)local_388._0_8_);
        }
        if ((char)__endptr != '\0') {
          p_Var12 = (_Base_ptr)
                    ((local_420.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          input = (string *)__errno_location();
          uVar3 = *(uint *)&(input->_M_dataplus)._M_p;
          *(int *)&(input->_M_dataplus)._M_p = 0;
          local_3f0._16_8_ = strtod((char *)p_Var12,(char **)&local_1b8);
          if (local_1b8 == p_Var12) {
            std::__throw_invalid_argument("stod");
LAB_001498b6:
            std::__throw_invalid_argument("stod");
LAB_001498c2:
            std::__throw_invalid_argument("stod");
            goto LAB_001498ce;
          }
          uVar13 = *(uint *)&(input->_M_dataplus)._M_p;
          if (uVar13 == 0) {
            *(uint *)&(input->_M_dataplus)._M_p = uVar3;
          }
          else {
            uVar3 = uVar13;
            if (uVar13 == 0x22) {
              std::__throw_out_of_range("stod");
              goto LAB_00149421;
            }
          }
          __endptr = (_Base_ptr *)(ulong)uVar3;
          p_Var12 = (_Base_ptr)
                    local_420.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          *(int *)&(input->_M_dataplus)._M_p = 0;
          local_400 = strtod((char *)p_Var12,(char **)&local_1b8);
          if (local_1b8 == p_Var12) goto LAB_001498b6;
          uVar13 = *(uint *)&(input->_M_dataplus)._M_p;
          if (uVar13 == 0) {
LAB_00149502:
            *(uint *)&(input->_M_dataplus)._M_p = uVar3;
            uVar13 = uVar3;
          }
          else if (uVar13 == 0x22) {
            std::__throw_out_of_range("stod");
            goto LAB_00149502;
          }
          p_Var12 = (_Base_ptr)
                    local_420.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          *(int *)&(input->_M_dataplus)._M_p = 0;
          local_408 = strtod((char *)p_Var12,(char **)&local_1b8);
          if (local_1b8 == p_Var12) goto LAB_001498c2;
          iVar11 = *(int *)&(input->_M_dataplus)._M_p;
          if (iVar11 == 0) {
LAB_00149553:
            *(uint *)&(input->_M_dataplus)._M_p = uVar13;
          }
          else if (iVar11 == 0x22) {
            std::__throw_out_of_range("stod");
            goto LAB_00149553;
          }
          if (0x60 < (ulong)((long)local_420.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_420.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            pcVar6 = local_420.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
            local_310._0_8_ = (_Base_ptr)(local_310 + 0x10);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_310,pcVar6,
                       pcVar6 + local_420.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
            bVar7 = Utils::IsNumber((string *)local_310);
            if ((_Base_ptr)local_310._0_8_ != (_Base_ptr)(local_310 + 0x10)) {
              operator_delete((void *)local_310._0_8_);
            }
            uVar10 = local_3f0._0_8_;
            if (bVar7) {
              p_Var12 = (_Base_ptr)
                        local_420.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
              iVar11 = *(int *)&(input->_M_dataplus)._M_p;
              *(int *)&(input->_M_dataplus)._M_p = 0;
              dVar15 = strtod((char *)p_Var12,(char **)&local_1b8);
              if (local_1b8 == p_Var12) goto LAB_001498da;
              iVar4 = *(int *)&(input->_M_dataplus)._M_p;
              if (iVar4 == 0) {
                *(int *)&(input->_M_dataplus)._M_p = iVar11;
              }
              else if (iVar4 == 0x22) {
                peVar8 = (element_type *)std::__throw_out_of_range("stod");
                local_3a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
                goto LAB_00149610;
              }
              Ship::SetSpeed((Ship *)uVar10,dVar15);
            }
          }
          goto LAB_0014968b;
        }
      }
      else {
LAB_00149325:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._0_8_ != local_3a8._M_pi) {
          operator_delete((void *)local_388._0_8_);
        }
      }
    }
LAB_00149421:
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_330,"Course not set, bad parameters\n","");
    local_3f0._24_8_ = (input->_M_dataplus)._M_p;
    local_3f0._32_8_ = input->_M_string_length;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._32_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._32_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._32_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._32_8_)->_M_use_count + 1;
      }
    }
    Sender::Send(&local_330,(shared_ptr<Connection> *)(local_3f0 + 0x18));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._32_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
  }
  else {
    pcVar6 = ((local_420.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_250._0_8_ = (_Base_ptr)(local_250 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_260 + 0x10),pcVar6,
               pcVar6 + (local_420.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    bVar7 = Utils::IsNumber((string *)(local_260 + 0x10));
    if ((_Base_ptr)local_250._0_8_ != (_Base_ptr)(local_250 + 0x10)) {
      operator_delete((void *)local_250._0_8_);
    }
    if (bVar7) goto LAB_001490db;
    name = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pcVar6 = ((local_420.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_270,pcVar6,
               pcVar6 + (local_420.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    GameData::GetPlanet((GameData *)&local_3a8,(string *)name);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    _Var14._M_pi = local_3a8._M_pi;
    if ((Ship *)local_3a8._M_pi == (Ship *)0x0) {
      p_Var12 = (_Base_ptr)(local_290 + 0x10);
      local_290._0_8_ = p_Var12;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_290,"That planet does not exist in this system\n","");
      local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(input->_M_dataplus)._M_p;
      peVar8 = (element_type *)input->_M_string_length;
      local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8;
      if (peVar8 != (element_type *)0x0) {
        if (__libc_single_threaded != '\0') {
          psVar1 = &(peVar8->super_Area).m_area_name._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
          goto LAB_00149614;
        }
LAB_00149610:
        LOCK();
        psVar1 = &(peVar8->super_Area).m_area_name._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
        _Var14._M_pi = local_3a8._M_pi;
      }
LAB_00149614:
      Sender::Send((string *)local_290,&local_3c8);
      if ((element_type *)
          local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3c8.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      local_3f0._16_8_ = (_Base_ptr)0x0;
      if ((_Base_ptr)local_290._0_8_ != p_Var12) {
        operator_delete((void *)local_290._0_8_);
      }
      local_400 = 0.0;
      local_408 = 0.0;
    }
    else {
      Planet::GetCoordinates((Planet *)local_3a8._M_pi);
      local_3f0._16_8_ = local_1b8;
      local_400 = local_1b0;
      local_408 = local_1a8[0];
      if (0x20 < (ulong)((long)local_420.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_420.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        pcVar6 = local_420.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        local_2b0._0_8_ = (_Base_ptr)(local_2b0 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b0,pcVar6,
                   pcVar6 + local_420.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        bVar7 = Utils::IsNumber((string *)local_2b0);
        if ((_Base_ptr)local_2b0._0_8_ != (_Base_ptr)(local_2b0 + 0x10)) {
          operator_delete((void *)local_2b0._0_8_);
        }
        uVar10 = local_3f0._0_8_;
        if (!bVar7) goto LAB_00149670;
        p_Var12 = (_Base_ptr)
                  local_420.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        input = (string *)__errno_location();
        local_3f4 = *(int *)&(input->_M_dataplus)._M_p;
        *(int *)&(input->_M_dataplus)._M_p = 0;
        __endptr = &local_1f0;
        dVar15 = strtod((char *)p_Var12,(char **)__endptr);
        if (local_1f0 != p_Var12) {
          iVar11 = *(int *)&(input->_M_dataplus)._M_p;
          if (iVar11 == 0) {
            *(int *)&(input->_M_dataplus)._M_p = local_3f4;
LAB_00149668:
            Ship::SetSpeed((Ship *)uVar10,dVar15);
            goto LAB_00149670;
          }
          if (iVar11 != 0x22) goto LAB_00149668;
          std::__throw_out_of_range("stod");
          goto LAB_00149325;
        }
LAB_001498ce:
        iVar11 = (int)__endptr;
        std::__throw_invalid_argument("stod");
LAB_001498da:
        uVar10 = std::__throw_invalid_argument("stod");
        if (*(int *)&(input->_M_dataplus)._M_p == 0) {
          *(int *)&(input->_M_dataplus)._M_p = iVar11;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._8_8_);
        }
        if (local_390 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_390);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_420);
        if ((undefined1 *)local_368._M_allocated_capacity != local_358) {
          operator_delete((void *)local_368._M_allocated_capacity);
        }
        _Unwind_Resume(uVar10);
      }
    }
LAB_00149670:
    if (local_3a0 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a0);
    }
    if ((Ship *)_Var14._M_pi == (Ship *)0x0) goto LAB_00149843;
LAB_0014968b:
    Ship::SetDestination((Ship *)local_3f0._0_8_,(double)local_3f0._16_8_,local_400,local_408);
    Ship::SetInOrbit((Ship *)local_3f0._0_8_,false);
    dVar15 = Ship::GetSpeed((Ship *)local_3f0._0_8_);
    ChangeSpeed(dVar15,(shared_ptr<Ship> *)local_3f0);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Course set for ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"X: ",3);
    poVar9 = std::ostream::_M_insert<double>((double)local_3f0._16_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," Y: ",4);
    poVar9 = std::ostream::_M_insert<double>(local_400);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," Z: ",4);
    poVar9 = std::ostream::_M_insert<double>(local_408);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," at speed ",10);
    dVar15 = Ship::GetSpeed((Ship *)local_3f0._0_8_);
    poVar9 = std::ostream::_M_insert<double>(dVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    std::__cxx11::stringbuf::str();
    GameData::GetLoggedInConnections
              ((map<int,_std::shared_ptr<Connection>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
                *)&local_1e8,
               (GameData *)
               (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    Ship::GetPlayerIDs((vector<int,_std::allocator<int>_> *)(local_358 + 0x10),
                       (Ship *)local_3f0._0_8_);
    Sender::SendToMultiple
              (&local_210,
               (map<int,_std::shared_ptr<Connection>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
                *)&local_1e8,(vector<int,_std::allocator<int>_> *)(local_358 + 0x10));
    if ((pointer)local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<Connection>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<Connection>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Connection>_>_>_>
    ::~_Rb_tree(&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
    std::ios_base::~ios_base(local_138);
  }
LAB_00149843:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0._8_8_);
  }
  if (local_390 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_390);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_420);
  if ((undefined1 *)local_368._M_allocated_capacity != local_358) {
    operator_delete((void *)local_368._M_allocated_capacity);
  }
  return;
}

Assistant:

void PlayingState::CmdSetCourse(const std::string &input, std::shared_ptr<Connection> connection,
                                std::shared_ptr<GameData> game_data) {
    std::string data = input;
    auto params = Tokenizer::GetAllTokens(data);
    double x = 0;
    double y = 0;
    double z = 0;
    auto player = connection->GetPlayer();
    bool course_set = false;
    auto ship = player->GetShip();
    if (CheckCockpitCommand(connection, game_data, true)) {
        // TODO: Skill check

        if (params.size() > 0 and !Utils::IsNumber(params[0])) {
            auto planet = game_data->GetPlanet(params[0]);
            if (planet == nullptr) {
                Sender::Send("That planet does not exist in this system\n", connection);
                return;
            }
            else {
                Utils::Vector3 coords = planet->GetCoordinates();
                x = coords.x;
                y = coords.y;
                z = coords.z;
                if (params.size() > 1 and Utils::IsNumber(params[1])) {
                    ship->SetSpeed(std::stod(params[1]));
                }
                course_set = true;
            }
        }
        else if (params.size() >= 3 and Utils::IsNumber(params[0])
                 and Utils::IsNumber(params[1]) and Utils::IsNumber(params[2])) {
            x = std::stod(params[0]);
            y = std::stod(params[1]);
            z = std::stod(params[2]);
            if (params.size() >= 4 and Utils::IsNumber(params[3])) {
                ship->SetSpeed(std::stod(params[3]));
            }
            course_set = true;
        }
        if (!course_set) {
            Sender::Send("Course not set, bad parameters\n", connection);
            return;
        }
        ship->SetDestination(x, y, z);
        ship->SetInOrbit(false);
        ChangeSpeed(ship->GetSpeed(), ship);
        std::stringstream ss;
        ss << "Course set for " << "X: " << x << " Y: " << y
        << " Z: " << z << " at speed " << ship->GetSpeed() << "\n";
        Sender::SendToMultiple(ss.str(), game_data->GetLoggedInConnections(),
                               ship->GetPlayerIDs());
    }
}